

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsRandomShaderCase.cpp
# Opt level: O0

vector<std::pair<int,_const_glu::TextureCube_*>,_std::allocator<std::pair<int,_const_glu::TextureCube_*>_>_>
* __thiscall
deqp::gls::TextureManager::getBindingsCube
          (vector<std::pair<int,_const_glu::TextureCube_*>,_std::allocator<std::pair<int,_const_glu::TextureCube_*>_>_>
           *__return_storage_ptr__,TextureManager *this)

{
  bool bVar1;
  reference __p;
  pair<int,_const_glu::TextureCube_*> local_40;
  _Self local_30;
  _Self local_28;
  const_iterator i;
  TextureManager *this_local;
  vector<std::pair<int,_const_glu::TextureCube_*>,_std::allocator<std::pair<int,_const_glu::TextureCube_*>_>_>
  *bindings;
  
  i._M_node._7_1_ = 0;
  std::
  vector<std::pair<int,_const_glu::TextureCube_*>,_std::allocator<std::pair<int,_const_glu::TextureCube_*>_>_>
  ::vector(__return_storage_ptr__);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<int,_const_glu::TextureCube_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_glu::TextureCube_*>_>_>
       ::begin(&this->m_texCube);
  while( true ) {
    local_30._M_node =
         (_Base_ptr)
         std::
         map<int,_const_glu::TextureCube_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_glu::TextureCube_*>_>_>
         ::end(&this->m_texCube);
    bVar1 = std::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    __p = std::_Rb_tree_const_iterator<std::pair<const_int,_const_glu::TextureCube_*>_>::operator*
                    (&local_28);
    std::pair<int,_const_glu::TextureCube_*>::pair<const_int,_const_glu::TextureCube_*,_true>
              (&local_40,__p);
    std::
    vector<std::pair<int,_const_glu::TextureCube_*>,_std::allocator<std::pair<int,_const_glu::TextureCube_*>_>_>
    ::push_back(__return_storage_ptr__,&local_40);
    std::_Rb_tree_const_iterator<std::pair<const_int,_const_glu::TextureCube_*>_>::operator++
              (&local_28,0);
  }
  return __return_storage_ptr__;
}

Assistant:

inline vector<pair<int, const glu::TextureCube*> > TextureManager::getBindingsCube (void) const
{
	vector<pair<int, const glu::TextureCube*> > bindings;
	for (map<int, const glu::TextureCube*>::const_iterator i = m_texCube.begin(); i != m_texCube.end(); i++)
		bindings.push_back(*i);
	return bindings;
}